

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.h
# Opt level: O2

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetSingletonInstanceUnchecked
          (DictionaryTypeHandlerBase<unsigned_short> *this,
          RecyclerWeakReference<Js::DynamicObject> *instance)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (((this->super_DynamicTypeHandler).flags & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryTypeHandler.h"
                                ,0xbd,"(!GetIsShared())","!GetIsShared()");
    if (!bVar2) goto LAB_00c26720;
    *puVar3 = 0;
  }
  if ((this->singletonInstance).ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryTypeHandler.h"
                                ,0xbe,"(this->singletonInstance == nullptr)",
                                "this->singletonInstance == nullptr");
    if (!bVar2) {
LAB_00c26720:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::WriteBarrierSet
            (&this->singletonInstance,instance);
  return;
}

Assistant:

virtual void SetSingletonInstanceUnchecked(RecyclerWeakReference<DynamicObject>* instance) override
        {
            Assert(!GetIsShared());
            Assert(this->singletonInstance == nullptr);
            this->singletonInstance = instance;
        }